

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_aaace::traversePrePost
          (anon_unknown_dwarf_aaace *this,Ref node,function<void_(cashew::Ref)> *visitPre,
          function<void_(cashew::Ref)> *visitPost)

{
  pointer __last;
  _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  *this_00;
  undefined1 __result [8];
  pointer pTVar1;
  pointer pTVar2;
  Ref node_00;
  _Tp_alloc_type *__alloc;
  char *__s;
  size_t __n;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__s_00;
  long lVar3;
  pointer pTVar4;
  Ref RVar5;
  pointer pRVar6;
  pointer __first;
  TraverseInfo local_98;
  pointer local_70;
  pointer local_68;
  function<void_(cashew::Ref)> *local_60;
  function<void_(cashew::Ref)> *local_58;
  _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  *local_50;
  undefined1 auStack_48 [8];
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  stack;
  
  auStack_48 = (undefined1  [8])0x0;
  stack.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = visitPre;
  local_58 = (function<void_(cashew::Ref)> *)node.inst;
  TraverseInfo::TraverseInfo(&local_98,(Ref)this);
  this_00 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             *)std::
               vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               ::_M_check_len((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                               *)auStack_48,(size_type)this,__s);
  __result = (undefined1  [8])
             std::
             _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             ::_M_allocate(this_00,(size_t)this);
  ((pointer)__result)->scanned = local_98.scanned;
  (((pointer)__result)->node).inst = local_98.node.inst;
  (((pointer)__result)->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_start;
  (((pointer)__result)->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (((pointer)__result)->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = std::
           vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
           ::_S_relocate((pointer)0x0,(pointer)0x0,(pointer)__result,(_Tp_alloc_type *)visitPost);
  pTVar1 = std::
           vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
           ::_S_relocate((pointer)0x0,(pointer)0x0,pTVar1 + 1,(_Tp_alloc_type *)visitPost);
  std::
  _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::_M_deallocate((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   *)0x0,(pointer)0x0,__n);
  __alloc = (_Tp_alloc_type *)auStack_48;
  stack.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__result + this_00 * 0x28);
  auStack_48 = __result;
  stack.
  super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pTVar1;
  std::_Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>::~_Vector_base
            (&local_98.children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>);
  while (__result != (undefined1  [8])pTVar1) {
    if (pTVar1[-1].scanned == false) {
      pTVar1[-1].scanned = true;
      RVar5.inst = pTVar1[-1].node.inst;
      std::function<void_(cashew::Ref)>::operator()(local_58,RVar5);
      local_70 = pTVar1[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      __s_00 = extraout_RDX;
      pTVar4 = stack.
               super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __first = (pointer)__result;
      for (pRVar6 = pTVar1[-1].children.
                    super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __last = stack.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          pTVar1 = stack.
                   super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start, __result = auStack_48,
          pRVar6 != local_70; pRVar6 = pRVar6 + 1) {
        node_00.inst = pRVar6->inst;
        if (stack.
            super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
            ._M_impl.super__Vector_impl_data._M_start == pTVar4) {
          local_50 = (_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                      *)std::
                        vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                        ::_M_check_len((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                                        *)auStack_48,(size_type)RVar5.inst,__s_00);
          pTVar1 = std::
                   _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ::_M_allocate(local_50,(size_t)RVar5.inst);
          lVar3 = (long)pTVar4 - (long)__first;
          local_68 = pRVar6;
          TraverseInfo::TraverseInfo((TraverseInfo *)((long)pTVar1 + lVar3),node_00);
          pTVar2 = std::
                   vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ::_S_relocate(__first,__last,pTVar1,__alloc);
          pTVar2 = std::
                   vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                   ::_S_relocate(__last,__last,pTVar2 + 1,__alloc);
          __alloc = (_Tp_alloc_type *)0x28;
          node_00.inst = (Value *)(lVar3 / 0x28);
          std::
          _Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
          ::_M_deallocate((_Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                           *)__first,(pointer)node_00.inst,lVar3 % 0x28);
          pTVar4 = pTVar1 + (long)local_50;
          __s_00 = extraout_RDX_01;
          pRVar6 = local_68;
          auStack_48 = (undefined1  [8])pTVar1;
          stack.
          super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTVar4;
        }
        else {
          TraverseInfo::TraverseInfo
                    (stack.
                     super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,node_00);
          pTVar2 = __last + 1;
          __s_00 = extraout_RDX_00;
          pTVar1 = __first;
        }
        RVar5.inst = node_00.inst;
        __first = pTVar1;
        stack.
        super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar2;
      }
    }
    else {
      RVar5.inst = pTVar1[-1].node.inst;
      stack.
      super__Vector_base<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = pTVar1 + -1;
      std::_Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>::~_Vector_base
                (&pTVar1[-1].children.super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>)
      ;
      std::function<void_(cashew::Ref)>::operator()(local_60,RVar5);
      pTVar1 = pTVar1 + -1;
      __result = auStack_48;
    }
  }
  std::
  vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
  ::~vector((vector<(anonymous_namespace)::TraverseInfo,_std::allocator<(anonymous_namespace)::TraverseInfo>_>
             *)auStack_48);
  return;
}

Assistant:

static void traversePrePost(Ref node,
                            std::function<void(Ref)> visitPre,
                            std::function<void(Ref)> visitPost) {
  std::vector<TraverseInfo> stack;
  stack.push_back(TraverseInfo(node));
  while (!stack.empty()) {
    TraverseInfo& back = stack.back();
    if (!back.scanned) {
      back.scanned = true;
      // This is the first time we see this.
      visitPre(back.node);
      for (auto child : back.children) {
        stack.emplace_back(child);
      }
      continue;
    }
    // Time to post-visit the node itself
    auto node = back.node;
    stack.pop_back();
    visitPost(node);
  }
}